

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::MetaVariable::set_value<tinyusdz::value::color3f>(MetaVariable *this,color3f *v)

{
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  linb::any::operator=((any *)this,v);
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  ::std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_30);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }